

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  size_t sVar1;
  byte *pbVar2;
  byte bVar3;
  byte *s_00;
  byte *pbVar4;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  pbVar4 = (byte *)s;
LAB_0032f03a:
  sVar1 = local_38.size;
  bVar3 = *pbVar4;
  s_00 = pbVar4;
  if (((anonymous_namespace)::chartype_table[bVar3] & 1) == 0) {
    pbVar4 = pbVar4 + 2;
    do {
      s_00 = pbVar4;
      bVar3 = s_00[-1];
      if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
        s_00 = s_00 + -1;
        goto LAB_0032f090;
      }
      bVar3 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) goto LAB_0032f090;
      bVar3 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
        s_00 = s_00 + 1;
        goto LAB_0032f090;
      }
      bVar3 = s_00[2];
      pbVar4 = s_00 + 4;
    } while (((anonymous_namespace)::chartype_table[bVar3] & 1) == 0);
    s_00 = s_00 + 2;
  }
LAB_0032f090:
  if (bVar3 == 0xd) {
    pbVar4 = s_00 + 1;
    *s_00 = 10;
    if (s_00[1] == 10) {
      if ((byte *)local_38.end != (byte *)0x0) {
        memmove(local_38.end + -local_38.size,local_38.end,(long)pbVar4 - (long)local_38.end);
      }
      pbVar4 = s_00 + 2;
      local_38.size = sVar1 + 1;
      local_38.end = (char_t *)pbVar4;
    }
    goto LAB_0032f03a;
  }
  if (bVar3 == 0x26) {
    pbVar4 = (byte *)strconv_escape((char_t *)s_00,&local_38);
    goto LAB_0032f03a;
  }
  if (bVar3 == 0) {
    pbVar4 = s_00;
    if ((byte *)local_38.end != (byte *)0x0) {
      memmove(local_38.end + -local_38.size,local_38.end,(long)s_00 - (long)local_38.end);
      pbVar4 = s_00 + -sVar1;
    }
    goto LAB_0032f183;
  }
  if (bVar3 != 0x3c) {
    pbVar4 = s_00 + 1;
    goto LAB_0032f03a;
  }
  pbVar4 = s_00;
  if ((byte *)local_38.end != (byte *)0x0) {
    memmove(local_38.end + -local_38.size,local_38.end,(long)s_00 - (long)local_38.end);
    pbVar4 = s_00 + -sVar1;
  }
  do {
    pbVar2 = pbVar4;
    if (pbVar2 <= s) break;
    pbVar4 = pbVar2 + -1;
  } while (((anonymous_namespace)::chartype_table[pbVar2[-1]] & 8) != 0);
  *pbVar2 = 0;
  return (char_t *)(s_00 + 1);
  while (pbVar4 = pbVar2 + -1, ((anonymous_namespace)::chartype_table[pbVar2[-1]] & 8) != 0) {
LAB_0032f183:
    pbVar2 = pbVar4;
    if (pbVar2 <= s) break;
  }
  *pbVar2 = 0;
  return (char_t *)s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}